

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_8.c
# Opt level: O3

parasail_result_t *
parasail_sw_diag_sse2_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  uint uVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  int8_t *ptr_02;
  ulong uVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined4 uVar36;
  undefined1 uVar52;
  undefined1 uVar53;
  __m128i_8_t A_1;
  undefined1 auVar37 [16];
  undefined1 uVar54;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar107;
  char cVar108;
  char cVar109;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  char cVar110;
  undefined1 auVar95 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  __m128i_8_t A;
  uint local_240;
  undefined1 local_228 [16];
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  undefined1 local_1c8 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  parasail_result_t *local_d0;
  ulong local_c8;
  ulong local_c0;
  int *local_b8;
  int *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar61;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar75;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse2_128_8_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_sse2_128_8_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_sse2_128_8_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_sse2_128_8_cold_4();
  }
  else {
    uVar34 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_diag_sse2_128_8_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_diag_sse2_128_8_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_diag_sse2_128_8_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar34 = (ulong)(uint)matrix->length;
      }
      iVar11 = matrix->min;
      uVar10 = (uint)(byte)-(char)iVar11;
      if (iVar11 != -open && SBORROW4(iVar11,-open) == iVar11 + open < 0) {
        uVar10 = open;
      }
      cVar9 = (char)uVar10 + -0x7f;
      cVar15 = '~' - (char)matrix->max;
      auVar37 = pshuflw(ZEXT216(CONCAT11(cVar9,cVar9)),ZEXT216(CONCAT11(cVar9,cVar9)),0);
      uVar36 = auVar37._0_4_;
      local_e8._4_4_ = uVar36;
      local_e8._0_4_ = uVar36;
      local_e8._8_4_ = uVar36;
      local_e8._12_4_ = uVar36;
      local_128._4_4_ = uVar36;
      local_128._0_4_ = uVar36;
      local_128._8_4_ = uVar36;
      local_128._12_4_ = uVar36;
      local_138._4_4_ = uVar36;
      local_138._0_4_ = uVar36;
      local_138._8_4_ = uVar36;
      local_138._12_4_ = uVar36;
      local_f8._4_4_ = uVar36;
      local_f8._0_4_ = uVar36;
      local_f8._8_4_ = uVar36;
      local_f8._12_4_ = uVar36;
      local_1d8 = auVar37[0];
      cStack_1d7 = auVar37[1];
      cStack_1d6 = auVar37[2];
      cStack_1d5 = auVar37[3];
      local_108._4_4_ = uVar36;
      local_108._0_4_ = uVar36;
      local_108._8_4_ = uVar36;
      local_108._12_4_ = uVar36;
      ppVar12 = parasail_result_new();
      if (ppVar12 != (parasail_result_t *)0x0) {
        ppVar12->flag = ppVar12->flag | 0x10101004;
        uVar13 = (ulong)(s2Len + 0x1e);
        ptr = parasail_memalign_int8_t(0x10,uVar13);
        ptr_00 = parasail_memalign_int8_t(0x10,uVar13);
        ptr_01 = parasail_memalign_int8_t(0x10,uVar13);
        if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (int8_t *)0x0)) {
          uVar10 = (uint)uVar34;
          if (matrix->type == 0) {
            iVar11 = uVar10 + 0xf;
            ptr_02 = parasail_memalign_int8_t(0x10,(long)iVar11);
            if (ptr_02 == (int8_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar10) {
              uVar13 = 0;
              do {
                ptr_02[uVar13] = (int8_t)matrix->mapper[(byte)_s1[uVar13]];
                uVar13 = uVar13 + 1;
              } while (uVar34 != uVar13);
            }
            iVar24 = uVar10 + 1;
            if ((int)(uVar10 + 1) < iVar11) {
              iVar24 = iVar11;
            }
            memset(ptr_02 + (int)uVar10,0,(ulong)(~uVar10 + iVar24) + 1);
          }
          else {
            ptr_02 = (int8_t *)0x0;
          }
          uVar32 = s2Len + 0xf;
          auVar37 = ZEXT216(CONCAT11(cVar15,cVar15));
          auVar37 = pshuflw(auVar37,auVar37,0);
          local_118 = auVar37[0];
          cStack_117 = auVar37[1];
          cStack_116 = auVar37[2];
          cStack_115 = auVar37[3];
          auVar37[4] = local_1d8;
          auVar37._0_4_ = uVar36;
          auVar37[5] = cStack_1d7;
          auVar37[6] = cStack_1d6;
          auVar37[7] = cStack_1d5;
          auVar37[8] = local_1d8;
          auVar37[9] = cStack_1d7;
          auVar37[10] = cStack_1d6;
          auVar37[0xb] = cStack_1d5;
          auVar37[0xc] = local_1d8;
          auVar37[0xd] = cStack_1d7;
          auVar37[0xe] = cStack_1d6;
          auVar37[0xf] = cStack_1d5;
          local_98 = auVar37 >> 8;
          uVar54 = (undefined1)((uint)open >> 0x18);
          uVar53 = (undefined1)((uint)open >> 0x10);
          uVar52 = (undefined1)((uint)open >> 8);
          auVar38._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar54,uVar54),uVar53),CONCAT14(uVar53,open)) >>
                    0x20);
          auVar38[3] = uVar52;
          auVar38[2] = uVar52;
          auVar38[0] = (undefined1)open;
          auVar38[1] = auVar38[0];
          auVar38._8_8_ = 0;
          auVar37 = pshuflw(auVar38,auVar38,0);
          local_68 = auVar37._0_4_;
          uVar54 = (undefined1)((uint)gap >> 0x18);
          uVar53 = (undefined1)((uint)gap >> 0x10);
          uVar52 = (undefined1)((uint)gap >> 8);
          auVar62._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar54,uVar54),uVar53),CONCAT14(uVar53,gap)) >> 0x20
                    );
          auVar62[3] = uVar52;
          auVar62[2] = uVar52;
          auVar62[0] = (undefined1)gap;
          auVar62[1] = auVar62[0];
          auVar62._8_8_ = 0;
          auVar37 = pshuflw(auVar62,auVar62,0);
          local_78 = auVar37._0_4_;
          auVar37 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),0);
          local_a8 = auVar37._0_4_;
          auVar37 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
          local_88 = auVar37._0_4_;
          uVar35 = (ulong)(uint)s2Len;
          uVar13 = 0;
          do {
            ptr[uVar13 + 0xf] = (int8_t)matrix->mapper[(byte)_s2[uVar13]];
            uVar13 = uVar13 + 1;
          } while (uVar35 != uVar13);
          uVar13 = 0;
          ptr[7] = '\0';
          ptr[8] = '\0';
          ptr[9] = '\0';
          ptr[10] = '\0';
          ptr[0xb] = '\0';
          ptr[0xc] = '\0';
          ptr[0xd] = '\0';
          ptr[0xe] = '\0';
          ptr[0] = '\0';
          ptr[1] = '\0';
          ptr[2] = '\0';
          ptr[3] = '\0';
          ptr[4] = '\0';
          ptr[5] = '\0';
          ptr[6] = '\0';
          ptr[7] = '\0';
          uVar27 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar32) {
            uVar27 = uVar32;
          }
          cStack_114 = local_118;
          cStack_113 = cStack_117;
          cStack_112 = cStack_116;
          cStack_111 = cStack_115;
          cStack_110 = local_118;
          cStack_10f = cStack_117;
          cStack_10e = cStack_116;
          cStack_10d = cStack_115;
          cStack_10c = local_118;
          cStack_10b = cStack_117;
          cStack_10a = cStack_116;
          cStack_109 = cStack_115;
          local_d0 = ppVar12;
          uStack_a4 = local_a8;
          uStack_a0 = local_a8;
          uStack_9c = local_a8;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          memset(ptr + uVar35 + 0xf,0,(ulong)(~s2Len + uVar27) + 1);
          ppVar12 = local_d0;
          do {
            ptr_00[uVar13 + 0xf] = '\0';
            ptr_01[uVar13 + 0xf] = cVar9;
            uVar13 = uVar13 + 1;
          } while (uVar35 != uVar13);
          lVar14 = 0;
          do {
            ptr_00[lVar14] = cVar9;
            ptr_01[lVar14] = cVar9;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0xf);
          lVar14 = uVar35 + 0xf;
          do {
            ptr_00[lVar14] = cVar9;
            ptr_01[lVar14] = cVar9;
            lVar14 = lVar14 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar32);
          if ((int)uVar10 < 1) {
            local_138[4] = local_1d8;
            local_138[5] = cStack_1d7;
            local_138[6] = cStack_1d6;
            local_138[7] = cStack_1d5;
            local_138[8] = local_1d8;
            local_138[9] = cStack_1d7;
            local_138[10] = cStack_1d6;
            local_138[0xb] = cStack_1d5;
            local_138[0xc] = local_1d8;
            local_138[0xd] = cStack_1d7;
            local_138[0xe] = cStack_1d6;
            local_138[0xf] = cStack_1d5;
            local_188[1] = cStack_117;
            local_188[0] = local_118;
            local_188[2] = cStack_116;
            local_188[3] = cStack_115;
            local_188[4] = cStack_114;
            local_188[5] = cStack_113;
            local_188[6] = cStack_112;
            local_188[7] = cStack_111;
            local_188[9] = cStack_10f;
            local_188[8] = cStack_110;
            local_188[10] = cStack_10e;
            local_188[0xb] = cStack_10d;
            local_188[0xc] = cStack_10c;
            local_188[0xd] = cStack_10b;
            local_188[0xe] = cStack_10a;
            local_188[0xf] = cStack_109;
            local_f8 = local_138;
            local_e8 = local_138;
            local_128 = local_138;
            local_108 = local_138;
            local_178 = local_138;
          }
          else {
            uVar10 = uVar10 - 1;
            local_c0 = 1;
            if (1 < (int)uVar32) {
              local_c0 = (ulong)uVar32;
            }
            local_208 = 7;
            sStack_206 = 6;
            sStack_204 = 5;
            sStack_202 = 4;
            sStack_200 = 3;
            sStack_1fe = 2;
            sStack_1fc = 1;
            sStack_1fa = 0;
            local_168 = 0xf;
            sStack_166 = 0xe;
            sStack_164 = 0xd;
            sStack_162 = 0xc;
            sStack_160 = 0xb;
            sStack_15e = 10;
            sStack_15c = 9;
            sStack_15a = 8;
            local_188[1] = cStack_117;
            local_188[0] = local_118;
            local_188[2] = cStack_116;
            local_188[3] = cStack_115;
            local_188[4] = cStack_114;
            local_188[5] = cStack_113;
            local_188[6] = cStack_112;
            local_188[7] = cStack_111;
            local_188[9] = cStack_10f;
            local_188[8] = cStack_110;
            local_188[10] = cStack_10e;
            local_188[0xb] = cStack_10d;
            local_188[0xc] = cStack_10c;
            local_188[0xd] = cStack_10b;
            local_188[0xe] = cStack_10a;
            local_188[0xf] = cStack_109;
            local_138[4] = local_1d8;
            local_138[5] = cStack_1d7;
            local_138[6] = cStack_1d6;
            local_138[7] = cStack_1d5;
            local_138[8] = local_1d8;
            local_138[9] = cStack_1d7;
            local_138[10] = cStack_1d6;
            local_138[0xb] = cStack_1d5;
            local_138[0xc] = local_1d8;
            local_138[0xd] = cStack_1d7;
            local_138[0xe] = cStack_1d6;
            local_138[0xf] = cStack_1d5;
            uVar13 = 0;
            local_f8 = local_138;
            local_e8 = local_138;
            local_128 = local_138;
            local_108 = local_138;
            local_178 = local_138;
            do {
              local_c8 = uVar13;
              if (matrix->type == 0) {
                uVar32 = (uint)ptr_02[local_c8];
                uVar16 = (uint)ptr_02[local_c8 + 1];
                uVar17 = (uint)ptr_02[local_c8 + 2];
                uVar27 = (uint)ptr_02[local_c8 + 3];
                uVar18 = (uint)ptr_02[local_c8 + 4];
                uVar31 = (uint)ptr_02[local_c8 + 5];
                uVar19 = (uint)ptr_02[local_c8 + 6];
                uVar26 = (uint)ptr_02[local_c8 + 7];
                uVar20 = (uint)ptr_02[local_c8 + 8];
                uVar33 = (uint)ptr_02[local_c8 + 9];
                uVar21 = (uint)ptr_02[local_c8 + 10];
                uVar30 = (uint)ptr_02[local_c8 + 0xb];
                uVar22 = (uint)ptr_02[local_c8 + 0xc];
                uVar25 = (uint)ptr_02[local_c8 + 0xd];
                uVar23 = (uint)ptr_02[local_c8 + 0xe];
                local_240 = (int)ptr_02[local_c8 + 0xf];
              }
              else {
                uVar32 = (uint)local_c8;
                uVar16 = uVar32 | 1;
                if (uVar34 <= (local_c8 | 1)) {
                  uVar16 = uVar10;
                }
                uVar17 = uVar32 | 2;
                if (uVar34 <= (local_c8 | 2)) {
                  uVar17 = uVar10;
                }
                uVar27 = uVar32 | 3;
                if (uVar34 <= (local_c8 | 3)) {
                  uVar27 = uVar10;
                }
                uVar18 = uVar32 | 4;
                if (uVar34 <= (local_c8 | 4)) {
                  uVar18 = uVar10;
                }
                uVar31 = uVar32 | 5;
                if (uVar34 <= (local_c8 | 5)) {
                  uVar31 = uVar10;
                }
                uVar19 = uVar32 | 6;
                if (uVar34 <= (local_c8 | 6)) {
                  uVar19 = uVar10;
                }
                uVar26 = uVar32 | 7;
                if (uVar34 <= (local_c8 | 7)) {
                  uVar26 = uVar10;
                }
                uVar20 = uVar32 | 8;
                if (uVar34 <= (local_c8 | 8)) {
                  uVar20 = uVar10;
                }
                uVar33 = uVar32 | 9;
                if (uVar34 <= (local_c8 | 9)) {
                  uVar33 = uVar10;
                }
                uVar21 = uVar32 | 10;
                if (uVar34 <= (local_c8 | 10)) {
                  uVar21 = uVar10;
                }
                uVar30 = uVar32 | 0xb;
                if (uVar34 <= (local_c8 | 0xb)) {
                  uVar30 = uVar10;
                }
                uVar22 = uVar32 | 0xc;
                if (uVar34 <= (local_c8 | 0xc)) {
                  uVar22 = uVar10;
                }
                uVar25 = uVar32 | 0xd;
                if (uVar34 <= (local_c8 | 0xd)) {
                  uVar25 = uVar10;
                }
                uVar23 = uVar32 | 0xe;
                if (uVar34 <= (local_c8 | 0xe)) {
                  uVar23 = uVar10;
                }
                local_240 = uVar32 | 0xf;
                if (uVar34 <= (local_c8 | 0xf)) {
                  local_240 = uVar10;
                }
              }
              iVar11 = matrix->size;
              piVar1 = matrix->matrix;
              local_b0 = piVar1 + (int)(uVar30 * iVar11);
              local_b8 = piVar1 + (int)(uVar33 * iVar11);
              auVar94._0_2_ = -(ushort)(local_168 < (short)local_a8);
              auVar94._2_2_ = -(ushort)(sStack_166 < local_a8._2_2_);
              auVar94._4_2_ = -(ushort)(sStack_164 < (short)uStack_a4);
              auVar94._6_2_ = -(ushort)(sStack_162 < uStack_a4._2_2_);
              auVar94._8_2_ = -(ushort)(sStack_160 < (short)uStack_a0);
              auVar94._10_2_ = -(ushort)(sStack_15e < uStack_a0._2_2_);
              auVar94._12_2_ = -(ushort)(sStack_15c < (short)uStack_9c);
              auVar94._14_2_ = -(ushort)(sStack_15a < uStack_9c._2_2_);
              auVar63._0_2_ = -(ushort)(local_208 < (short)local_a8);
              auVar63._2_2_ = -(ushort)(sStack_206 < local_a8._2_2_);
              auVar63._4_2_ = -(ushort)(sStack_204 < (short)uStack_a4);
              auVar63._6_2_ = -(ushort)(sStack_202 < uStack_a4._2_2_);
              auVar63._8_2_ = -(ushort)(sStack_200 < (short)uStack_a0);
              auVar63._10_2_ = -(ushort)(sStack_1fe < uStack_a0._2_2_);
              auVar63._12_2_ = -(ushort)(sStack_1fc < (short)uStack_9c);
              auVar63._14_2_ = -(ushort)(sStack_1fa < uStack_9c._2_2_);
              local_58 = packsswb(auVar94,auVar63);
              auVar74[4] = local_1d8;
              auVar74._0_4_ = uVar36;
              auVar74[5] = cStack_1d7;
              auVar74[6] = cStack_1d6;
              auVar74[7] = cStack_1d5;
              auVar74[8] = local_1d8;
              auVar74[9] = cStack_1d7;
              auVar74[10] = cStack_1d6;
              auVar74[0xb] = cStack_1d5;
              auVar74[0xc] = local_1d8;
              auVar74[0xd] = cStack_1d7;
              auVar74[0xe] = cStack_1d6;
              auVar74[0xf] = cStack_1d5;
              local_228 = local_98;
              uVar13 = 0;
              auVar37 = auVar74;
              auVar111 = _DAT_00904d00;
              auVar112 = _DAT_00904ee0;
              local_1c8._0_8_ = local_98._0_8_;
              local_1c8._8_8_ = local_98._8_8_;
              do {
                auVar93[0xf] = (char)piVar1[(long)(int)(uVar32 * iVar11) + (long)ptr[uVar13 + 0xf]];
                auVar93[0xe] = (char)piVar1[(long)(int)(uVar16 * iVar11) + (long)ptr[uVar13 + 0xe]];
                auVar93[0xd] = (char)piVar1[(long)(int)(uVar17 * iVar11) + (long)ptr[uVar13 + 0xd]];
                auVar93[0xc] = (char)piVar1[(long)(int)(uVar27 * iVar11) + (long)ptr[uVar13 + 0xc]];
                auVar93[0xb] = (char)piVar1[(long)(int)(uVar18 * iVar11) + (long)ptr[uVar13 + 0xb]];
                auVar93[10] = (char)piVar1[(long)(int)(uVar31 * iVar11) + (long)ptr[uVar13 + 10]];
                auVar93[9] = (char)piVar1[(long)(int)(uVar19 * iVar11) + (long)ptr[uVar13 + 9]];
                auVar93[8] = (char)piVar1[(long)(int)(uVar26 * iVar11) + (long)ptr[uVar13 + 8]];
                auVar93[7] = (char)piVar1[(long)(int)(uVar20 * iVar11) + (long)ptr[uVar13 + 7]];
                auVar93[6] = (char)local_b8[ptr[uVar13 + 6]];
                auVar93[5] = (char)piVar1[(long)(int)(uVar21 * iVar11) + (long)ptr[uVar13 + 5]];
                auVar93[4] = (char)local_b0[ptr[uVar13 + 4]];
                auVar93[3] = (char)piVar1[(long)(int)(uVar22 * iVar11) + (long)ptr[uVar13 + 3]];
                auVar93[2] = (char)piVar1[(long)(int)(uVar25 * iVar11) + (long)ptr[uVar13 + 2]];
                auVar93[0] = (undefined1)piVar1[(long)(int)(local_240 * iVar11) + (long)ptr[uVar13]]
                ;
                auVar93[1] = (char)piVar1[(long)(int)(uVar23 * iVar11) + (long)ptr[uVar13 + 1]];
                auVar94 = paddsb(auVar93,local_1c8);
                auVar62 = ZEXT116((byte)ptr_00[uVar13 + 0xf]) << 0x78 | local_228 >> 8;
                auVar8._4_4_ = uStack_64;
                auVar8._0_4_ = local_68;
                auVar8._8_4_ = uStack_60;
                auVar8._12_4_ = uStack_5c;
                auVar63 = psubsb(auVar62,auVar8);
                auVar7._4_4_ = uStack_74;
                auVar7._0_4_ = local_78;
                auVar7._8_4_ = uStack_70;
                auVar7._12_4_ = uStack_6c;
                auVar38 = psubsb(ZEXT116((byte)ptr_01[uVar13 + 0xf]) << 0x78 | auVar74 >> 8,auVar7);
                auVar73[0] = -(auVar38[0] < auVar63[0]);
                auVar73[1] = -(auVar38[1] < auVar63[1]);
                auVar73[2] = -(auVar38[2] < auVar63[2]);
                auVar73[3] = -(auVar38[3] < auVar63[3]);
                auVar73[4] = -(auVar38[4] < auVar63[4]);
                auVar73[5] = -(auVar38[5] < auVar63[5]);
                auVar73[6] = -(auVar38[6] < auVar63[6]);
                auVar73[7] = -(auVar38[7] < auVar63[7]);
                auVar73[8] = -(auVar38[8] < auVar63[8]);
                auVar73[9] = -(auVar38[9] < auVar63[9]);
                auVar73[10] = -(auVar38[10] < auVar63[10]);
                auVar73[0xb] = -(auVar38[0xb] < auVar63[0xb]);
                auVar73[0xc] = -(auVar38[0xc] < auVar63[0xc]);
                auVar73[0xd] = -(auVar38[0xd] < auVar63[0xd]);
                auVar73[0xe] = -(auVar38[0xe] < auVar63[0xe]);
                auVar73[0xf] = -(auVar38[0xf] < auVar63[0xf]);
                auVar74 = ~auVar73 & auVar38 | auVar63 & auVar73;
                auVar38 = psubsb(local_228,auVar8);
                auVar37 = psubsb(auVar37,auVar7);
                auVar39[0] = -(auVar37[0] < auVar38[0]);
                auVar39[1] = -(auVar37[1] < auVar38[1]);
                auVar39[2] = -(auVar37[2] < auVar38[2]);
                auVar39[3] = -(auVar37[3] < auVar38[3]);
                auVar39[4] = -(auVar37[4] < auVar38[4]);
                auVar39[5] = -(auVar37[5] < auVar38[5]);
                auVar39[6] = -(auVar37[6] < auVar38[6]);
                auVar39[7] = -(auVar37[7] < auVar38[7]);
                auVar39[8] = -(auVar37[8] < auVar38[8]);
                auVar39[9] = -(auVar37[9] < auVar38[9]);
                auVar39[10] = -(auVar37[10] < auVar38[10]);
                auVar39[0xb] = -(auVar37[0xb] < auVar38[0xb]);
                auVar39[0xc] = -(auVar37[0xc] < auVar38[0xc]);
                auVar39[0xd] = -(auVar37[0xd] < auVar38[0xd]);
                auVar39[0xe] = -(auVar37[0xe] < auVar38[0xe]);
                auVar39[0xf] = -(auVar37[0xf] < auVar38[0xf]);
                auVar37 = ~auVar39 & auVar37 | auVar38 & auVar39;
                auVar55[0] = -(auVar37[0] < auVar94[0]);
                auVar55[1] = -(auVar37[1] < auVar94[1]);
                auVar55[2] = -(auVar37[2] < auVar94[2]);
                auVar55[3] = -(auVar37[3] < auVar94[3]);
                auVar55[4] = -(auVar37[4] < auVar94[4]);
                auVar55[5] = -(auVar37[5] < auVar94[5]);
                auVar55[6] = -(auVar37[6] < auVar94[6]);
                auVar55[7] = -(auVar37[7] < auVar94[7]);
                auVar55[8] = -(auVar37[8] < auVar94[8]);
                auVar55[9] = -(auVar37[9] < auVar94[9]);
                auVar55[10] = -(auVar37[10] < auVar94[10]);
                auVar55[0xb] = -(auVar37[0xb] < auVar94[0xb]);
                auVar55[0xc] = -(auVar37[0xc] < auVar94[0xc]);
                auVar55[0xd] = -(auVar37[0xd] < auVar94[0xd]);
                auVar55[0xe] = -(auVar37[0xe] < auVar94[0xe]);
                auVar55[0xf] = -(auVar37[0xf] < auVar94[0xf]);
                auVar38 = ~auVar55 & auVar37 | auVar94 & auVar55;
                auVar64[0] = -(auVar74[0] < auVar38[0]);
                auVar64[1] = -(auVar74[1] < auVar38[1]);
                auVar64[2] = -(auVar74[2] < auVar38[2]);
                auVar64[3] = -(auVar74[3] < auVar38[3]);
                auVar64[4] = -(auVar74[4] < auVar38[4]);
                auVar64[5] = -(auVar74[5] < auVar38[5]);
                auVar64[6] = -(auVar74[6] < auVar38[6]);
                auVar64[7] = -(auVar74[7] < auVar38[7]);
                auVar64[8] = -(auVar74[8] < auVar38[8]);
                auVar64[9] = -(auVar74[9] < auVar38[9]);
                auVar64[10] = -(auVar74[10] < auVar38[10]);
                auVar64[0xb] = -(auVar74[0xb] < auVar38[0xb]);
                auVar64[0xc] = -(auVar74[0xc] < auVar38[0xc]);
                auVar64[0xd] = -(auVar74[0xd] < auVar38[0xd]);
                auVar64[0xe] = -(auVar74[0xe] < auVar38[0xe]);
                auVar64[0xf] = -(auVar74[0xf] < auVar38[0xf]);
                auVar38 = ~auVar64 & auVar74 | auVar38 & auVar64;
                auVar56[0] = -('\0' < auVar38[0]);
                auVar56[1] = -('\0' < auVar38[1]);
                auVar56[2] = -('\0' < auVar38[2]);
                auVar56[3] = -('\0' < auVar38[3]);
                auVar56[4] = -('\0' < auVar38[4]);
                auVar56[5] = -('\0' < auVar38[5]);
                auVar56[6] = -('\0' < auVar38[6]);
                auVar56[7] = -('\0' < auVar38[7]);
                auVar56[8] = -('\0' < auVar38[8]);
                auVar56[9] = -('\0' < auVar38[9]);
                auVar56[10] = -('\0' < auVar38[10]);
                auVar56[0xb] = -('\0' < auVar38[0xb]);
                auVar56[0xc] = -('\0' < auVar38[0xc]);
                auVar56[0xd] = -('\0' < auVar38[0xd]);
                auVar56[0xe] = -('\0' < auVar38[0xe]);
                auVar56[0xf] = -('\0' < auVar38[0xf]);
                sVar75 = auVar112._0_2_;
                auVar76._0_2_ = -(ushort)(sVar75 == -1);
                sVar77 = auVar112._2_2_;
                auVar76._2_2_ = -(ushort)(sVar77 == -1);
                sVar78 = auVar112._4_2_;
                auVar76._4_2_ = -(ushort)(sVar78 == -1);
                sVar79 = auVar112._6_2_;
                auVar76._6_2_ = -(ushort)(sVar79 == -1);
                sVar80 = auVar112._8_2_;
                auVar76._8_2_ = -(ushort)(sVar80 == -1);
                sVar81 = auVar112._10_2_;
                auVar76._10_2_ = -(ushort)(sVar81 == -1);
                sVar82 = auVar112._12_2_;
                sVar83 = auVar112._14_2_;
                auVar76._12_2_ = -(ushort)(sVar82 == -1);
                auVar76._14_2_ = -(ushort)(sVar83 == -1);
                sVar61 = auVar111._0_2_;
                auVar65._0_2_ = -(ushort)(sVar61 == -1);
                sVar66 = auVar111._2_2_;
                auVar65._2_2_ = -(ushort)(sVar66 == -1);
                sVar67 = auVar111._4_2_;
                auVar65._4_2_ = -(ushort)(sVar67 == -1);
                sVar68 = auVar111._6_2_;
                auVar65._6_2_ = -(ushort)(sVar68 == -1);
                sVar69 = auVar111._8_2_;
                auVar65._8_2_ = -(ushort)(sVar69 == -1);
                sVar70 = auVar111._10_2_;
                auVar65._10_2_ = -(ushort)(sVar70 == -1);
                sVar71 = auVar111._12_2_;
                sVar72 = auVar111._14_2_;
                auVar65._12_2_ = -(ushort)(sVar71 == -1);
                auVar65._14_2_ = -(ushort)(sVar72 == -1);
                auVar63 = packsswb(auVar76,auVar65);
                local_228 = ~auVar63 & auVar56 & auVar38;
                auVar5[4] = local_1d8;
                auVar5._0_4_ = uVar36;
                auVar5[5] = cStack_1d7;
                auVar5[6] = cStack_1d6;
                auVar5[7] = cStack_1d5;
                auVar5[8] = local_1d8;
                auVar5[9] = cStack_1d7;
                auVar5[10] = cStack_1d6;
                auVar5[0xb] = cStack_1d5;
                auVar5[0xc] = local_1d8;
                auVar5[0xd] = cStack_1d7;
                auVar5[0xe] = cStack_1d6;
                auVar5[0xf] = cStack_1d5;
                auVar74 = ~auVar63 & auVar74 | auVar63 & auVar5;
                cVar15 = local_228[0];
                cVar96 = local_228[1];
                cVar110 = local_228[0xf];
                cVar97 = local_228[2];
                cVar98 = local_228[3];
                cVar99 = local_228[4];
                cVar100 = local_228[5];
                cVar101 = local_228[6];
                cVar102 = local_228[7];
                cVar103 = local_228[8];
                cVar104 = local_228[9];
                cVar105 = local_228[10];
                cVar106 = local_228[0xb];
                cVar107 = local_228[0xc];
                cVar108 = local_228[0xd];
                cVar109 = local_228[0xe];
                if (0xf < uVar13) {
                  auVar40[0] = -(cVar15 < local_188[0]);
                  auVar40[1] = -(cVar96 < local_188[1]);
                  auVar40[2] = -(cVar97 < local_188[2]);
                  auVar40[3] = -(cVar98 < local_188[3]);
                  auVar40[4] = -(cVar99 < local_188[4]);
                  auVar40[5] = -(cVar100 < local_188[5]);
                  auVar40[6] = -(cVar101 < local_188[6]);
                  auVar40[7] = -(cVar102 < local_188[7]);
                  auVar40[8] = -(cVar103 < local_188[8]);
                  auVar40[9] = -(cVar104 < local_188[9]);
                  auVar40[10] = -(cVar105 < local_188[10]);
                  auVar40[0xb] = -(cVar106 < local_188[0xb]);
                  auVar40[0xc] = -(cVar107 < local_188[0xc]);
                  auVar40[0xd] = -(cVar108 < local_188[0xd]);
                  auVar40[0xe] = -(cVar109 < local_188[0xe]);
                  auVar40[0xf] = -(cVar110 < local_188[0xf]);
                  local_188 = ~auVar40 & local_188 | local_228 & auVar40;
                  auVar57[0] = -(cVar15 < local_178[0]);
                  auVar57[1] = -(cVar96 < local_178[1]);
                  auVar57[2] = -(cVar97 < local_178[2]);
                  auVar57[3] = -(cVar98 < local_178[3]);
                  auVar57[4] = -(cVar99 < local_178[4]);
                  auVar57[5] = -(cVar100 < local_178[5]);
                  auVar57[6] = -(cVar101 < local_178[6]);
                  auVar57[7] = -(cVar102 < local_178[7]);
                  auVar57[8] = -(cVar103 < local_178[8]);
                  auVar57[9] = -(cVar104 < local_178[9]);
                  auVar57[10] = -(cVar105 < local_178[10]);
                  auVar57[0xb] = -(cVar106 < local_178[0xb]);
                  auVar57[0xc] = -(cVar107 < local_178[0xc]);
                  auVar57[0xd] = -(cVar108 < local_178[0xd]);
                  auVar57[0xe] = -(cVar109 < local_178[0xe]);
                  auVar57[0xf] = -(cVar110 < local_178[0xf]);
                  local_178 = local_178 & auVar57 | ~auVar57 & local_228;
                }
                auVar37 = ~auVar63 & auVar37 | auVar63 & auVar5;
                auVar41._0_2_ = -(ushort)(-1 < sVar75);
                auVar41._2_2_ = -(ushort)(-1 < sVar77);
                auVar41._4_2_ = -(ushort)(-1 < sVar78);
                auVar41._6_2_ = -(ushort)(-1 < sVar79);
                auVar41._8_2_ = -(ushort)(-1 < sVar80);
                auVar41._10_2_ = -(ushort)(-1 < sVar81);
                auVar41._12_2_ = -(ushort)(-1 < sVar82);
                auVar41._14_2_ = -(ushort)(-1 < sVar83);
                auVar58._0_2_ = -(ushort)(-1 < sVar61);
                auVar58._2_2_ = -(ushort)(-1 < sVar66);
                auVar58._4_2_ = -(ushort)(-1 < sVar67);
                auVar58._6_2_ = -(ushort)(-1 < sVar68);
                auVar58._8_2_ = -(ushort)(-1 < sVar69);
                auVar58._10_2_ = -(ushort)(-1 < sVar70);
                auVar58._12_2_ = -(ushort)(-1 < sVar71);
                auVar58._14_2_ = -(ushort)(-1 < sVar72);
                auVar38 = packsswb(auVar41,auVar58);
                auVar116._0_2_ = -(ushort)(sVar75 < (short)local_88);
                auVar116._2_2_ = -(ushort)(sVar77 < local_88._2_2_);
                auVar116._4_2_ = -(ushort)(sVar78 < (short)uStack_84);
                auVar116._6_2_ = -(ushort)(sVar79 < uStack_84._2_2_);
                auVar116._8_2_ = -(ushort)(sVar80 < (short)uStack_80);
                auVar116._10_2_ = -(ushort)(sVar81 < uStack_80._2_2_);
                auVar116._12_2_ = -(ushort)(sVar82 < (short)uStack_7c);
                auVar116._14_2_ = -(ushort)(sVar83 < uStack_7c._2_2_);
                auVar59._0_2_ = -(ushort)(sVar61 < (short)local_88);
                auVar59._2_2_ = -(ushort)(sVar66 < local_88._2_2_);
                auVar59._4_2_ = -(ushort)(sVar67 < (short)uStack_84);
                auVar59._6_2_ = -(ushort)(sVar68 < uStack_84._2_2_);
                auVar59._8_2_ = -(ushort)(sVar69 < (short)uStack_80);
                auVar59._10_2_ = -(ushort)(sVar70 < uStack_80._2_2_);
                auVar59._12_2_ = -(ushort)(sVar71 < (short)uStack_7c);
                auVar59._14_2_ = -(ushort)(sVar72 < uStack_7c._2_2_);
                auVar63 = packsswb(auVar116,auVar59);
                auVar38 = auVar63 & local_58 & auVar38;
                auVar114[0] = -(cVar15 == local_e8[0]);
                auVar114[1] = -(cVar96 == local_e8[1]);
                auVar114[2] = -(cVar97 == local_e8[2]);
                auVar114[3] = -(cVar98 == local_e8[3]);
                auVar114[4] = -(cVar99 == local_e8[4]);
                auVar114[5] = -(cVar100 == local_e8[5]);
                auVar114[6] = -(cVar101 == local_e8[6]);
                auVar114[7] = -(cVar102 == local_e8[7]);
                auVar114[8] = -(cVar103 == local_e8[8]);
                auVar114[9] = -(cVar104 == local_e8[9]);
                auVar114[10] = -(cVar105 == local_e8[10]);
                auVar114[0xb] = -(cVar106 == local_e8[0xb]);
                auVar114[0xc] = -(cVar107 == local_e8[0xc]);
                auVar114[0xd] = -(cVar108 == local_e8[0xd]);
                auVar114[0xe] = -(cVar109 == local_e8[0xe]);
                auVar114[0xf] = -(cVar110 == local_e8[0xf]);
                auVar95[0] = -(local_e8[0] < cVar15);
                auVar95[1] = -(local_e8[1] < cVar96);
                auVar95[2] = -(local_e8[2] < cVar97);
                auVar95[3] = -(local_e8[3] < cVar98);
                auVar95[4] = -(local_e8[4] < cVar99);
                auVar95[5] = -(local_e8[5] < cVar100);
                auVar95[6] = -(local_e8[6] < cVar101);
                auVar95[7] = -(local_e8[7] < cVar102);
                auVar95[8] = -(local_e8[8] < cVar103);
                auVar95[9] = -(local_e8[9] < cVar104);
                auVar95[10] = -(local_e8[10] < cVar105);
                auVar95[0xb] = -(local_e8[0xb] < cVar106);
                auVar95[0xc] = -(local_e8[0xc] < cVar107);
                auVar95[0xd] = -(local_e8[0xd] < cVar108);
                auVar95[0xe] = -(local_e8[0xe] < cVar109);
                auVar95[0xf] = -(local_e8[0xf] < cVar110);
                auVar95 = auVar95 & auVar38;
                auVar84[1] = auVar95[8];
                auVar84[0] = auVar95[8];
                auVar84[2] = auVar95[9];
                auVar84[3] = auVar95[9];
                auVar84[4] = auVar95[10];
                auVar84[5] = auVar95[10];
                auVar84[6] = auVar95[0xb];
                auVar84[7] = auVar95[0xb];
                auVar84[8] = auVar95[0xc];
                auVar84[9] = auVar95[0xc];
                auVar84[10] = auVar95[0xd];
                auVar84[0xb] = auVar95[0xd];
                auVar84[0xc] = auVar95[0xe];
                auVar84[0xd] = auVar95[0xe];
                auVar84[0xf] = auVar95[0xf];
                auVar84[0xe] = auVar84[0xf];
                auVar3._2_2_ = sStack_206;
                auVar3._0_2_ = local_208;
                auVar3._4_2_ = sStack_204;
                auVar3._6_2_ = sStack_202;
                auVar3._8_2_ = sStack_200;
                auVar3._10_2_ = sStack_1fe;
                auVar3._12_2_ = sStack_1fc;
                auVar3._14_2_ = sStack_1fa;
                auVar113._0_2_ = -(ushort)(sVar75 < local_f8._0_2_);
                auVar113._2_2_ = -(ushort)(sVar77 < local_f8._2_2_);
                auVar113._4_2_ = -(ushort)(sVar78 < local_f8._4_2_);
                auVar113._6_2_ = -(ushort)(sVar79 < local_f8._6_2_);
                auVar113._8_2_ = -(ushort)(sVar80 < local_f8._8_2_);
                auVar113._10_2_ = -(ushort)(sVar81 < local_f8._10_2_);
                auVar113._12_2_ = -(ushort)(sVar82 < local_f8._12_2_);
                auVar113._14_2_ = -(ushort)(sVar83 < local_f8._14_2_);
                auVar42._0_2_ = -(ushort)(sVar61 < local_108._0_2_);
                auVar42._2_2_ = -(ushort)(sVar66 < local_108._2_2_);
                auVar42._4_2_ = -(ushort)(sVar67 < local_108._4_2_);
                auVar42._6_2_ = -(ushort)(sVar68 < local_108._6_2_);
                auVar42._8_2_ = -(ushort)(sVar69 < local_108._8_2_);
                auVar42._10_2_ = -(ushort)(sVar70 < local_108._10_2_);
                auVar42._12_2_ = -(ushort)(sVar71 < local_108._12_2_);
                auVar42._14_2_ = -(ushort)(sVar72 < local_108._14_2_);
                auVar63 = packsswb(auVar113,auVar42);
                auVar50._0_14_ = auVar95._0_14_;
                auVar50[0xe] = auVar95[7];
                auVar50[0xf] = auVar95[7];
                auVar49._14_2_ = auVar50._14_2_;
                auVar49._0_13_ = auVar95._0_13_;
                auVar49[0xd] = auVar95[6];
                auVar48._13_3_ = auVar49._13_3_;
                auVar48._0_12_ = auVar95._0_12_;
                auVar48[0xc] = auVar95[6];
                auVar47._12_4_ = auVar48._12_4_;
                auVar47._0_11_ = auVar95._0_11_;
                auVar47[0xb] = auVar95[5];
                auVar46._11_5_ = auVar47._11_5_;
                auVar46._0_10_ = auVar95._0_10_;
                auVar46[10] = auVar95[5];
                auVar45._10_6_ = auVar46._10_6_;
                auVar45._0_9_ = auVar95._0_9_;
                auVar45[9] = auVar95[4];
                auVar44._9_7_ = auVar45._9_7_;
                auVar44._0_8_ = auVar95._0_8_;
                auVar44[8] = auVar95[4];
                auVar43._8_8_ = auVar44._8_8_;
                auVar43[7] = auVar95[3];
                auVar43[6] = auVar95[3];
                auVar43[5] = auVar95[2];
                auVar43[4] = auVar95[2];
                auVar43[3] = auVar95[1];
                auVar43[2] = auVar95[1];
                auVar43[0] = auVar95[0];
                auVar43[1] = auVar43[0];
                local_e8 = ~auVar95 & local_e8 | local_228 & auVar95;
                auVar6._2_2_ = sStack_166;
                auVar6._0_2_ = local_168;
                auVar6._4_2_ = sStack_164;
                auVar6._6_2_ = sStack_162;
                auVar6._8_2_ = sStack_160;
                auVar6._10_2_ = sStack_15e;
                auVar6._12_2_ = sStack_15c;
                auVar6._14_2_ = sStack_15a;
                auVar114 = auVar63 & auVar38 & auVar114;
                auVar92._0_14_ = auVar114._0_14_;
                auVar92[0xe] = auVar114[7];
                auVar92[0xf] = auVar114[7];
                auVar91._14_2_ = auVar92._14_2_;
                auVar91._0_13_ = auVar114._0_13_;
                auVar91[0xd] = auVar114[6];
                auVar90._13_3_ = auVar91._13_3_;
                auVar90._0_12_ = auVar114._0_12_;
                auVar90[0xc] = auVar114[6];
                auVar89._12_4_ = auVar90._12_4_;
                auVar89._0_11_ = auVar114._0_11_;
                auVar89[0xb] = auVar114[5];
                auVar88._11_5_ = auVar89._11_5_;
                auVar88._0_10_ = auVar114._0_10_;
                auVar88[10] = auVar114[5];
                auVar87._10_6_ = auVar88._10_6_;
                auVar87._0_9_ = auVar114._0_9_;
                auVar87[9] = auVar114[4];
                auVar86._9_7_ = auVar87._9_7_;
                auVar86._0_8_ = auVar114._0_8_;
                auVar86[8] = auVar114[4];
                auVar85._8_8_ = auVar86._8_8_;
                auVar85[7] = auVar114[3];
                auVar85[6] = auVar114[3];
                auVar85[5] = auVar114[2];
                auVar85[4] = auVar114[2];
                auVar85[3] = auVar114[1];
                auVar85[2] = auVar114[1];
                auVar85[0] = auVar114[0];
                auVar85[1] = auVar85[0];
                auVar115[1] = auVar114[8];
                auVar115[0] = auVar114[8];
                auVar115[2] = auVar114[9];
                auVar115[3] = auVar114[9];
                auVar115[4] = auVar114[10];
                auVar115[5] = auVar114[10];
                auVar115[6] = auVar114[0xb];
                auVar115[7] = auVar114[0xb];
                auVar115[8] = auVar114[0xc];
                auVar115[9] = auVar114[0xc];
                auVar115[10] = auVar114[0xd];
                auVar115[0xb] = auVar114[0xd];
                auVar115[0xc] = auVar114[0xe];
                auVar115[0xd] = auVar114[0xe];
                auVar115[0xf] = auVar114[0xf];
                auVar115[0xe] = auVar115[0xf];
                local_128 = auVar6 & auVar85 | ~auVar85 & (auVar6 & auVar43 | ~auVar43 & local_128);
                auVar4._2_2_ = sStack_206;
                auVar4._0_2_ = local_208;
                auVar4._4_2_ = sStack_204;
                auVar4._6_2_ = sStack_202;
                auVar4._8_2_ = sStack_200;
                auVar4._10_2_ = sStack_1fe;
                auVar4._12_2_ = sStack_1fc;
                auVar4._14_2_ = sStack_1fa;
                local_138 = auVar4 & auVar115 |
                            ~auVar115 & (auVar3 & auVar84 | ~auVar84 & local_138);
                local_f8 = ~auVar85 & (~auVar43 & local_f8 | auVar112 & auVar43) |
                           auVar112 & auVar85;
                local_108 = ~auVar115 & (~auVar84 & local_108 | auVar111 & auVar84) |
                            auVar111 & auVar115;
                local_48 = local_228._0_8_;
                uStack_40 = local_228._8_8_;
                ptr_00[uVar13] = cVar15;
                ptr_01[uVar13] = auVar74[0];
                auVar112._0_2_ = sVar75 + 1;
                auVar112._2_2_ = sVar77 + 1;
                auVar112._4_2_ = sVar78 + 1;
                auVar112._6_2_ = sVar79 + 1;
                auVar112._8_2_ = sVar80 + 1;
                auVar112._10_2_ = sVar81 + 1;
                auVar112._12_2_ = sVar82 + 1;
                auVar112._14_2_ = sVar83 + 1;
                auVar111._0_2_ = sVar61 + 1;
                auVar111._2_2_ = sVar66 + 1;
                auVar111._4_2_ = sVar67 + 1;
                auVar111._6_2_ = sVar68 + 1;
                auVar111._8_2_ = sVar69 + 1;
                auVar111._10_2_ = sVar70 + 1;
                auVar111._12_2_ = sVar71 + 1;
                auVar111._14_2_ = sVar72 + 1;
                uVar13 = uVar13 + 1;
                local_1c8._0_8_ = auVar62._0_8_;
                local_1c8._8_8_ = auVar62._8_8_;
              } while (local_c0 != uVar13);
              local_168 = local_168 + 0x10;
              sStack_166 = sStack_166 + 0x10;
              sStack_164 = sStack_164 + 0x10;
              sStack_162 = sStack_162 + 0x10;
              sStack_160 = sStack_160 + 0x10;
              sStack_15e = sStack_15e + 0x10;
              sStack_15c = sStack_15c + 0x10;
              sStack_15a = sStack_15a + 0x10;
              local_208 = local_208 + 0x10;
              sStack_206 = sStack_206 + 0x10;
              sStack_204 = sStack_204 + 0x10;
              sStack_202 = sStack_202 + 0x10;
              sStack_200 = sStack_200 + 0x10;
              sStack_1fe = sStack_1fe + 0x10;
              sStack_1fc = sStack_1fc + 0x10;
              sStack_1fa = sStack_1fa + 0x10;
              uVar13 = local_c8 + 0x10;
            } while (local_c8 + 0x10 < uVar34);
          }
          lVar14 = 0;
          iVar29 = 0;
          iVar11 = 0;
          iVar24 = 0;
          do {
            cVar15 = local_e8[lVar14];
            if (cVar9 < cVar15) {
              iVar11 = (int)*(short *)(local_128 + lVar14 * 2);
              iVar24 = (int)*(short *)(local_f8 + lVar14 * 2);
              iVar29 = (int)*(short *)(local_128 + lVar14 * 2);
              cVar9 = cVar15;
            }
            else if (cVar15 == cVar9) {
              iVar28 = (int)*(short *)(local_f8 + lVar14 * 2);
              if (iVar28 < iVar24) {
                iVar11 = (int)*(short *)(local_128 + lVar14 * 2);
                iVar24 = iVar28;
                iVar29 = (int)*(short *)(local_128 + lVar14 * 2);
              }
              else if ((iVar24 == iVar28) &&
                      (iVar28 = (int)*(short *)(local_128 + lVar14 * 2), bVar2 = iVar28 <= iVar11,
                      iVar11 = iVar29, bVar2)) {
                iVar11 = iVar28;
                iVar29 = iVar28;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          lVar14 = 0;
          do {
            cVar15 = local_e8[lVar14 + 8];
            if (cVar9 < cVar15) {
              iVar11 = (int)*(short *)(local_138 + lVar14 * 2);
              iVar24 = (int)*(short *)(local_108 + lVar14 * 2);
              cVar9 = cVar15;
            }
            else if (cVar15 == cVar9) {
              iVar29 = (int)*(short *)(local_108 + lVar14 * 2);
              if (iVar29 < iVar24) {
                iVar11 = (int)*(short *)(local_138 + lVar14 * 2);
                iVar24 = iVar29;
              }
              else if ((iVar24 == iVar29) && (*(short *)(local_138 + lVar14 * 2) <= iVar11)) {
                iVar11 = (int)*(short *)(local_138 + lVar14 * 2);
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          auVar51[0] = -(local_188[0] < local_1d8);
          auVar51[1] = -(local_188[1] < cStack_1d7);
          auVar51[2] = -(local_188[2] < cStack_1d6);
          auVar51[3] = -(local_188[3] < cStack_1d5);
          auVar51[4] = -(local_188[4] < local_1d8);
          auVar51[5] = -(local_188[5] < cStack_1d7);
          auVar51[6] = -(local_188[6] < cStack_1d6);
          auVar51[7] = -(local_188[7] < cStack_1d5);
          auVar51[8] = -(local_188[8] < local_1d8);
          auVar51[9] = -(local_188[9] < cStack_1d7);
          auVar51[10] = -(local_188[10] < cStack_1d6);
          auVar51[0xb] = -(local_188[0xb] < cStack_1d5);
          auVar51[0xc] = -(local_188[0xc] < local_1d8);
          auVar51[0xd] = -(local_188[0xd] < cStack_1d7);
          auVar51[0xe] = -(local_188[0xe] < cStack_1d6);
          auVar51[0xf] = -(local_188[0xf] < cStack_1d5);
          auVar60[0] = -(local_118 < local_178[0]);
          auVar60[1] = -(cStack_117 < local_178[1]);
          auVar60[2] = -(cStack_116 < local_178[2]);
          auVar60[3] = -(cStack_115 < local_178[3]);
          auVar60[4] = -(cStack_114 < local_178[4]);
          auVar60[5] = -(cStack_113 < local_178[5]);
          auVar60[6] = -(cStack_112 < local_178[6]);
          auVar60[7] = -(cStack_111 < local_178[7]);
          auVar60[8] = -(cStack_110 < local_178[8]);
          auVar60[9] = -(cStack_10f < local_178[9]);
          auVar60[10] = -(cStack_10e < local_178[10]);
          auVar60[0xb] = -(cStack_10d < local_178[0xb]);
          auVar60[0xc] = -(cStack_10c < local_178[0xc]);
          auVar60[0xd] = -(cStack_10b < local_178[0xd]);
          auVar60[0xe] = -(cStack_10a < local_178[0xe]);
          auVar60[0xf] = -(cStack_109 < local_178[0xf]);
          auVar60 = auVar60 | auVar51;
          if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar60 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            *(byte *)&local_d0->flag = (byte)local_d0->flag | 0x40;
            cVar9 = '\0';
            iVar24 = 0;
            iVar11 = 0;
          }
          local_d0->score = (int)cVar9;
          local_d0->end_query = iVar11;
          local_d0->end_ref = iVar24;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar12;
          }
          return ppVar12;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne16;
    __m128i vNegOne16;
    __m128i vN16;
    __m128i vILo16;
    __m128i vIHi16;
    __m128i vJresetLo16;
    __m128i vJresetHi16;
    __m128i vMaxH;
    __m128i vEndILo;
    __m128i vEndIHi;
    __m128i vEndJLo;
    __m128i vEndJHi;
    __m128i vILimit16;
    __m128i vJLimit16;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 1); /* shift in a 0 */
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    vOne16 = _mm_set1_epi16(1);
    vNegOne16 = _mm_set1_epi16(-1);
    vN16 = _mm_set1_epi16(N);
    vILo16 = _mm_set_epi16(8,9,10,11,12,13,14,15);
    vIHi16 = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJresetLo16 = _mm_set_epi16(-8,-9,-10,-11,-12,-13,-14,-15);
    vJresetHi16 = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndILo = vNegInf;
    vEndIHi = vNegInf;
    vEndJLo = vNegInf;
    vEndJHi = vNegInf;
    vILimit16 = _mm_set1_epi16(s1Len);
    vJLimit16 = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJLo16 = vJresetLo16;
        __m128i vJHi16 = vJresetHi16;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m128i vIltLimit = _mm_packs_epi16(
                    _mm_cmplt_epi16(vILo16, vILimit16),
                    _mm_cmplt_epi16(vIHi16, vILimit16));
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8_rpl(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, F_pr[j], 15);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8_rpl(vNWH, vE);
            vWH = _mm_max_epi8_rpl(vWH, vF);
            vWH = _mm_max_epi8_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_packs_epi16(
                        _mm_cmpeq_epi16(vJLo16,vNegOne16),
                        _mm_cmpeq_epi16(vJHi16,vNegOne16));
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_packs_epi16(
                            _mm_cmpgt_epi16(vJLo16, vNegOne16),
                            _mm_cmpgt_epi16(vJHi16, vNegOne16)),
                        _mm_packs_epi16(
                            _mm_cmplt_epi16(vJLo16, vJLimit16),
                            _mm_cmplt_epi16(vJHi16, vJLimit16)));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi8(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi8(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_packs_epi16(
                        _mm_cmplt_epi16(vJLo16, vEndJLo),
                        _mm_cmplt_epi16(vJHi16, vEndJHi));
                __m128i cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                __m128i cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
            }
            vJLo16 = _mm_add_epi16(vJLo16, vOne16);
            vJHi16 = _mm_add_epi16(vJHi16, vOne16);
        }
        vILo16 = _mm_add_epi16(vILo16, vN16);
        vIHi16 = _mm_add_epi16(vIHi16, vN16);
    }

    /* alignment ending position */
    {
        int8_t *t = (int8_t*)&vMaxH;
        int16_t *ilo = (int16_t*)&vEndILo;
        int16_t *jlo = (int16_t*)&vEndJLo;
        int16_t *ihi = (int16_t*)&vEndIHi;
        int16_t *jhi = (int16_t*)&vEndJHi;
        int32_t k;
        for (k=0; k<N/2; ++k, ++t, ++ilo, ++jlo) {
            if (*t > score) {
                score = *t;
                end_query = *ilo;
                end_ref = *jlo;
            }
            else if (*t == score) {
                if (*jlo < end_ref) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
                else if (*jlo == end_ref && *ilo < end_query) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
            }
        }
        for (k=N/2; k<N; ++k, ++t, ++ihi, ++jhi) {
            if (*t > score) {
                score = *t;
                end_query = *ihi;
                end_ref = *jhi;
            }
            else if (*t == score) {
                if (*jhi < end_ref) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
                else if (*jhi == end_ref && *ihi < end_query) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}